

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

int __thiscall smf::MidiFile::linkNotePairs(MidiFile *this)

{
  int iVar1;
  reference ppMVar2;
  int local_18;
  int local_14;
  int sum;
  int i;
  MidiFile *this_local;
  
  local_18 = 0;
  for (local_14 = 0; iVar1 = getTrackCount(this), local_14 < iVar1; local_14 = local_14 + 1) {
    ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)local_14);
    if (*ppMVar2 != (value_type)0x0) {
      ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                          (&this->m_events,(long)local_14);
      iVar1 = MidiEventList::linkNotePairs(*ppMVar2);
      local_18 = iVar1 + local_18;
    }
  }
  this->m_linkedEventsQ = true;
  return local_18;
}

Assistant:

int MidiFile::linkNotePairs(void) {
	int i;
	int sum = 0;
	for (i=0; i<getTrackCount(); i++) {
		if (m_events[i] == NULL) {
			continue;
		}
		sum += m_events[i]->linkNotePairs();
	}
	m_linkedEventsQ = true;
	return sum;
}